

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.h
# Opt level: O0

void puppup::board::print(State *state,State *other)

{
  long lVar1;
  _Setfill<char> _Var2;
  _Setw _Var3;
  ostream *poVar4;
  const_reference pvVar5;
  long local_30;
  idx j_1;
  idx j;
  idx i;
  State *other_local;
  State *state_local;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"Score: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,state->score);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  for (j = 0; j < 0xf; j = j + 1) {
    poVar4 = std::operator<<((ostream *)&std::cout,"ABCDEFGHIJKLMNOPQRSTUVWXYZ"[j]);
    std::operator<<(poVar4," ");
    for (j_1 = 0; j_1 < 0xf; j_1 = j_1 + 1) {
      pvVar5 = std::array<long,_256UL>::operator[](&state->board,j * 0x10 + j_1);
      if (*pvVar5 == 0x1b) {
        if (*(long *)(letter_multiplier + (j * 0x10 + j_1) * 8) == 2) {
          std::operator<<((ostream *)&std::cout,"\x1b[1;46m + \x1b[0m");
        }
        else if (*(long *)(letter_multiplier + (j * 0x10 + j_1) * 8) == 3) {
          std::operator<<((ostream *)&std::cout,"\x1b[1;104m + \x1b[0m");
        }
        else if (*(long *)(word_multiplier + (j * 0x10 + j_1) * 8) == 2) {
          std::operator<<((ostream *)&std::cout,"\x1b[1;45m + \x1b[0m");
        }
        else if (*(long *)(word_multiplier + (j * 0x10 + j_1) * 8) == 3) {
          std::operator<<((ostream *)&std::cout,"\x1b[1;41m + \x1b[0m");
        }
        else {
          std::operator<<((ostream *)&std::cout,"\x1b[47m   \x1b[0m");
        }
      }
      else {
        pvVar5 = std::array<long,_256UL>::operator[](&state->board,j * 0x10 + j_1);
        lVar1 = *pvVar5;
        pvVar5 = std::array<long,_256UL>::operator[](&other->board,j * 0x10 + j_1);
        if (lVar1 == *pvVar5) {
          pvVar5 = std::array<long,_256UL>::operator[](&state->letter_score,j * 0x10 + j_1);
          if (*pvVar5 == 0) {
            poVar4 = std::operator<<((ostream *)&std::cout,"\x1b[1;103;31m ");
            pvVar5 = std::array<long,_256UL>::operator[](&state->board,j * 0x10 + j_1);
            poVar4 = std::operator<<(poVar4,"EIAONTRSULDGYWVPMHFCBZXQKJ_    +"[*pvVar5]);
            std::operator<<(poVar4," \x1b[0m");
          }
          else {
            poVar4 = std::operator<<((ostream *)&std::cout,"\x1b[1;103;30m ");
            pvVar5 = std::array<long,_256UL>::operator[](&state->board,j * 0x10 + j_1);
            poVar4 = std::operator<<(poVar4,"EIAONTRSULDGYWVPMHFCBZXQKJ_    +"[*pvVar5]);
            std::operator<<(poVar4," \x1b[0m");
          }
        }
        else {
          pvVar5 = std::array<long,_256UL>::operator[](&state->letter_score,j * 0x10 + j_1);
          if (*pvVar5 == 0) {
            poVar4 = std::operator<<((ostream *)&std::cout,"\x1b[1;33;31m ");
            pvVar5 = std::array<long,_256UL>::operator[](&state->board,j * 0x10 + j_1);
            poVar4 = std::operator<<(poVar4,"EIAONTRSULDGYWVPMHFCBZXQKJ_    +"[*pvVar5]);
            std::operator<<(poVar4," \x1b[0m");
          }
          else {
            poVar4 = std::operator<<((ostream *)&std::cout,"\x1b[1;37;40m ");
            pvVar5 = std::array<long,_256UL>::operator[](&state->board,j * 0x10 + j_1);
            poVar4 = std::operator<<(poVar4,"EIAONTRSULDGYWVPMHFCBZXQKJ_    +"[*pvVar5]);
            std::operator<<(poVar4," \x1b[0m");
          }
        }
      }
    }
    std::operator<<((ostream *)&std::cout,"\n");
  }
  std::operator<<((ostream *)&std::cout," ");
  for (local_30 = 0; local_30 < 0xf; local_30 = local_30 + 1) {
    _Var2 = std::setfill<char>(' ');
    poVar4 = std::operator<<(&std::cout,_Var2._M_c);
    _Var3 = std::setw(3);
    poVar4 = std::operator<<(poVar4,_Var3);
    std::ostream::operator<<(poVar4,local_30 + 1);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

inline void print(const State& state, const State& other) {
    std::cout << "Score: " << state.score << std::endl;
    for (idx i = board_min; i <= board_max; ++i) {
        std::cout << ABC[i - board_min] << " ";
        for (idx j = board_min; j <= board_max; ++j) {
            if (state.board[i * 16 + j] != emptiness) {
                if (state.board[i * 16 + j] == other.board[i * 16 + j]) {
                    if (state.letter_score[i * 16 + j] == 0) {
                        std::cout << "\033[1;103;31m "
                                  << idxSTR[state.board[i * 16 + j]]
                                  << " \033[0m";
                    } else {
                        std::cout << "\033[1;103;30m "
                                  << idxSTR[state.board[i * 16 + j]]
                                  << " \033[0m";
                    }
                } else {
                    if (state.letter_score[i * 16 + j] == 0) {
                        std::cout << "\033[1;33;31m "
                                  << idxSTR[state.board[i * 16 + j]]
                                  << " \033[0m";
                    } else {
                        std::cout << "\033[1;37;40m "
                                  << idxSTR[state.board[i * 16 + j]]
                                  << " \033[0m";
                    }
                }
            } else {
                if (letter_multiplier[i * 16 + j] == 2) {
                    std::cout << "\033[1;46m + \033[0m";
                } else if (letter_multiplier[i * 16 + j] == 3) {
                    std::cout << "\033[1;104m + \033[0m";
                } else if (word_multiplier[i * 16 + j] == 2) {
                    std::cout << "\033[1;45m + \033[0m";
                } else if (word_multiplier[i * 16 + j] == 3) {
                    std::cout << "\033[1;41m + \033[0m";
                } else {
                    std::cout << "\033[47m   \33[0m";
                }
            }
        }
        std::cout << "\n";
    }
    std::cout << " ";
    for (idx j = board_min; j <= board_max; ++j) {
        std::cout << std::setfill(' ') << std::setw(3) << j + 1 - board_min;
    }
    std::cout << std::endl;
}